

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fy-input.c
# Opt level: O3

fy_input * fy_input_from_data(char *data,size_t size,fy_atom *handle,_Bool simple)

{
  fy_input *fyi;
  
  if (size == 0xffffffffffffffff && data != (char *)0x0) {
    size = strlen(data);
  }
  fyi = (fy_input *)calloc(1,0x90);
  if (fyi != (fy_input *)0x0) {
    fyi->refs = 1;
    (fyi->cfg).type = fyit_memory;
    (fyi->cfg).field_2.stream.name = data;
    (fyi->cfg).field_2.memory.size = size;
    fy_input_from_data_setup(fyi,handle,simple);
  }
  return fyi;
}

Assistant:

struct fy_input *fy_input_from_data(const char *data, size_t size,
                                    struct fy_atom *handle, bool simple) {
    struct fy_input *fyi;

    if (data && size == (size_t) -1)
        size = strlen(data);

    fyi = fy_input_alloc();
    if (!fyi)
        return NULL;

    fyi->cfg.type = fyit_memory;
    fyi->cfg.userdata = NULL;
    fyi->cfg.memory.data = data;
    fyi->cfg.memory.size = size;

    fy_input_from_data_setup(fyi, handle, simple);

    return fyi;
}